

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hex_encoder.cpp
# Opt level: O2

string * __thiscall
bidfx_public_api::tools::HexEncoder::EncodeAsHex_abi_cxx11_
          (string *__return_storage_ptr__,HexEncoder *this,uchar *bytes,size_t len)

{
  unsigned_long i;
  uchar *puVar1;
  stringstream ss;
  stringstream asStack_1b8 [16];
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_1b8);
  for (puVar1 = (uchar *)0x0; bytes != puVar1; puVar1 = puVar1 + 1) {
    std::operator<<(local_1a8,*(char *)(HEX_CHARS + (ulong)((byte)this[(long)puVar1] >> 4)));
    std::operator<<(local_1a8,*(char *)(HEX_CHARS + (ulong)((byte)this[(long)puVar1] & 0xf)));
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string HexEncoder::EncodeAsHex(unsigned char* bytes, size_t len)
{
    std::stringstream ss;

    for (unsigned long i = 0u; i < len; i++)
    {
        ss << HexEncoder::HEX_CHARS[((unsigned int) bytes[i] >> 4u & 0xfu)];
        ss << HexEncoder::HEX_CHARS[(unsigned int) bytes[i] & 0xfu];
    }

    return ss.str();
}